

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

void __thiscall
cppcms::json::variant::
create<std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>>
          (variant *this,
          map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
          *v)

{
  this->type = is_object;
  std::
  _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
  ::_Rb_tree((_Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
              *)this,&v->_M_t);
  return;
}

Assistant:

void create(T const &v)
		{
			void *p=ptr();
			type = json_type_traits<T>::type;
			switch(type) {
			case is_undefined:
			case is_null:
			case is_boolean:
			case is_number:
				memcpy(&m,&v,sizeof(T));
				break;
			case is_string:
				new(p) std::string(reinterpret_cast<std::string const &>(v));
				break;
			case is_object:
				new(p) object(reinterpret_cast<object const &>(v));
				break;
			case is_array:
				new(p) array(reinterpret_cast<array const &>(v));
				break;
			}
		}